

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int ParseEXRMultipartHeaderFromMemory
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,uchar *memory,
              char **err)

{
  int iVar1;
  char *pcVar2;
  size_type sVar3;
  void *pvVar4;
  size_type sVar5;
  long in_RCX;
  long in_RDX;
  undefined4 *in_RSI;
  long *in_RDI;
  undefined8 *in_R8;
  EXRHeader *exr_header;
  size_t i;
  int ret;
  bool empty_header;
  string err_str;
  HeaderInfo info;
  vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> infos;
  char *marker;
  char *buf;
  uchar *in_stack_00000268;
  string *in_stack_00000270;
  EXRVersion *in_stack_00000278;
  bool *in_stack_00000280;
  HeaderInfo *in_stack_00000288;
  anon_struct_128_15_3efe3611 *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  string *this;
  size_type local_120;
  undefined4 in_stack_fffffffffffffee8;
  int iVar6;
  uint in_stack_fffffffffffffef4;
  string local_108 [148];
  int local_74;
  uint local_60;
  vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> local_58;
  long local_40;
  undefined8 *local_30;
  long local_20;
  undefined4 *local_18;
  long *local_10;
  int local_4;
  
  if ((((in_RCX == 0) || (in_RDI == (long *)0x0)) || (in_RSI == (undefined4 *)0x0)) || (in_RDX == 0)
     ) {
    local_4 = -3;
  }
  else {
    local_40 = in_RCX + 8;
    local_30 = in_R8;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::vector
              ((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *)0x160a3c);
    while( true ) {
      tinyexr::anon_struct_128_15_3efe3611::HeaderInfo(in_stack_fffffffffffffeb0);
      tinyexr::anon_struct_128_15_3efe3611::clear(in_stack_fffffffffffffeb0);
      this = local_108;
      std::__cxx11::string::string(this);
      in_stack_fffffffffffffef4 = in_stack_fffffffffffffef4 & 0xffffff;
      iVar1 = tinyexr::ParseEXRHeader
                        (in_stack_00000288,in_stack_00000280,in_stack_00000278,in_stack_00000270,
                         in_stack_00000268);
      if (iVar1 == 0) {
        if ((in_stack_fffffffffffffef4 & 0x1000000) == 0) {
          if (local_74 == 0) {
            if (local_30 != (undefined8 *)0x0) {
              *local_30 = "`chunkCount\' attribute is not found in the header.";
            }
            local_4 = -4;
            iVar6 = 1;
          }
          else {
            std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::push_back
                      ((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *)this,
                       (value_type *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            local_40 = local_40 + (ulong)local_60;
            iVar6 = 0;
          }
        }
        else {
          local_40 = local_40 + 1;
          iVar6 = 2;
        }
      }
      else {
        if (local_30 != (undefined8 *)0x0) {
          pcVar2 = (char *)std::__cxx11::string::c_str();
          pcVar2 = strdup(pcVar2);
          *local_30 = pcVar2;
        }
        iVar6 = 1;
        local_4 = iVar1;
      }
      std::__cxx11::string::~string(local_108);
      tinyexr::anon_struct_128_15_3efe3611::~HeaderInfo(in_stack_fffffffffffffeb0);
      if (iVar6 != 0) break;
      in_stack_fffffffffffffebc = 0;
    }
    if (iVar6 == 2) {
      sVar3 = std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::size
                        (&local_58);
      pvVar4 = malloc(sVar3 << 3);
      *local_10 = (long)pvVar4;
      local_120 = 0;
      while (sVar3 = local_120,
            sVar5 = std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::size
                              (&local_58), sVar3 < sVar5) {
        pvVar4 = malloc(0x10890);
        std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::operator[]
                  (&local_58,local_120);
        tinyexr::ConvertHeader
                  ((EXRHeader *)CONCAT44(in_stack_fffffffffffffef4,iVar1),
                   (HeaderInfo *)CONCAT44(iVar6,in_stack_fffffffffffffee8));
        *(undefined4 *)((long)pvVar4 + 0x38) = *(undefined4 *)(local_20 + 4);
        *(void **)(*local_10 + local_120 * 8) = pvVar4;
        local_120 = local_120 + 1;
      }
      sVar3 = std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::size
                        (&local_58);
      *local_18 = (int)sVar3;
      local_4 = 0;
    }
    std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::~vector
              ((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *)this);
  }
  return local_4;
}

Assistant:

int ParseEXRMultipartHeaderFromMemory(EXRHeader ***exr_headers,
                                      int *num_headers,
                                      const EXRVersion *exr_version,
                                      const unsigned char *memory,
                                      const char **err) {
  if (memory == NULL || exr_headers == NULL || num_headers == NULL ||
      exr_version == NULL) {
    // Invalid argument
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  const char *buf = reinterpret_cast<const char *>(memory);

  const char *marker = &buf[4 + 4];  // skip magic number + version header

  std::vector<tinyexr::HeaderInfo> infos;

  for (;;) {
    tinyexr::HeaderInfo info;
    info.clear();

    std::string err_str;
    bool empty_header = false;
    int ret = ParseEXRHeader(&info, &empty_header, exr_version, &err_str,
                             reinterpret_cast<const unsigned char *>(marker));

    if (ret != TINYEXR_SUCCESS) {
      if (err) {
        (*err) = strdup(err_str.c_str());  // may leak
      }
      return ret;
    }

    if (empty_header) {
      marker += 1;  // skip '\0'
      break;
    }

    // `chunkCount` must exist in the header.
    if (info.chunk_count == 0) {
      if (err) {
        (*err) = "`chunkCount' attribute is not found in the header.";
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    infos.push_back(info);

    // move to next header.
    marker += info.header_len;
  }

  // allocate memory for EXRHeader and create array of EXRHeader pointers.
  (*exr_headers) =
      static_cast<EXRHeader **>(malloc(sizeof(EXRHeader *) * infos.size()));
  for (size_t i = 0; i < infos.size(); i++) {
    EXRHeader *exr_header = static_cast<EXRHeader *>(malloc(sizeof(EXRHeader)));

    ConvertHeader(exr_header, infos[i]);

    // transfoer `tiled` from version.
    exr_header->tiled = exr_version->tiled;

    (*exr_headers)[i] = exr_header;
  }

  (*num_headers) = static_cast<int>(infos.size());

  return TINYEXR_SUCCESS;
}